

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemMap.cpp
# Opt level: O0

void __thiscall MemMap::~MemMap(MemMap *this)

{
  int *in_RDI;
  
  if (*(long *)(in_RDI + 10) != 0) {
    munmap(*(void **)(in_RDI + 10),*(size_t *)(in_RDI + 0xc));
  }
  if ((*in_RDI != -1) && (*in_RDI != 0)) {
    close(*in_RDI);
  }
  std::__cxx11::string::~string((string *)(in_RDI + 2));
  return;
}

Assistant:

MemMap::~MemMap() {
    if (mmap_ptr != nullptr) {
        munmap(mmap_ptr, fsize);
    }

    if (fd != -1 && fd != 0) {
        close(fd);
    }
}